

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

bool __thiscall
google::protobuf::Reflection::IsFieldPresentGivenHasbits
          (Reflection *this,Message *message,FieldDescriptor *field,uint32_t *hasbits,
          uint32_t hasbit_index)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  string_view str;
  LogMessage LStack_28;
  
  bVar2 = anon_unknown_6::IsIndexInHasBitSet(hasbits,hasbit_index);
  if (bVar2) {
    bVar3 = FieldDescriptor::has_presence(field);
    bVar2 = true;
    if (!bVar3) {
      bVar1 = field->field_0x1;
      if (0xbf < bVar1 == (bool)((bVar1 & 0x20) >> 5)) {
        if ((bVar1 & 0x20) == 0) {
          if ((field->containing_type_ != (Descriptor *)0x0) &&
             ((field->containing_type_->options_->field_0)._impl_.map_entry_ != false)) {
            return true;
          }
          bVar2 = IsSingularFieldNonEmpty(this,message,field);
          return bVar2;
        }
      }
      else {
        IsFieldPresentGivenHasbits();
      }
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&LStack_28,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
                 ,0xc3a,"!field->is_repeated()");
      str._M_str = "repeated fields do not have hasbits in proto3.";
      str._M_len = 0x2e;
      absl::lts_20250127::log_internal::LogMessage::
      CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                (&LStack_28,str);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&LStack_28);
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool Reflection::IsFieldPresentGivenHasbits(const Message& message,
                                            const FieldDescriptor* field,
                                            const uint32_t* hasbits,
                                            uint32_t hasbit_index) const {
  // If hasbit exists but is not set, field is guaranteed to be missing.
  if (!IsIndexInHasBitSet(hasbits, hasbit_index)) {
    return false;
  }

  // For explicit-presence fields, a set hasbit indicates a present field.
  if (field->has_presence()) {
    return true;
  }

  // proto3: hasbits are present, but an additional zero check must be
  // performed because hasbit can be set to true while field is zero.

  // Repeated fields do not have hasbits enabled in proto3.
  ABSL_DCHECK(!field->is_repeated())
      << "repeated fields do not have hasbits in proto3.";

  // Handling map entries in proto3:
  // Implicit presence map fields are represented as a native C++ map, but their
  // corresponding MapEntry messages (e.g. if we want to access them as repeated
  // MapEntry fields) will unconditionally be generated with hasbits. MapEntrys
  // behave like explicit presence fields. That is, in MapEntry's C++
  // implementation...
  // - key can be null, empty, or nonempty;
  // - value can be null, empty, or nonempty.
  if (IsMapEntry(field)) {
    return true;
  }

  // This is the vanilla case: for a non-repeated primitive or string field,
  // returns if the field is nonzero (i.e. present in proto3 semantics).
  return IsSingularFieldNonEmpty(message, field);
}